

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllObjectTableFields
          (RustGenerator *this,StructDef *table,function<void_(const_flatbuffers::FieldDef_&)> *cb)

{
  int *piVar1;
  int iVar2;
  FieldDef *field;
  pointer ppFVar3;
  allocator<char> local_89;
  CodeWriter *local_88;
  function<void_(const_flatbuffers::FieldDef_&)> *local_80;
  IdlNamer *local_78;
  string local_70;
  string local_50;
  
  local_88 = &this->code_;
  local_78 = &this->namer_;
  local_80 = cb;
  for (ppFVar3 = (table->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar3 !=
      (table->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    field = *ppFVar3;
    if (field->deprecated == false) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD",&local_89);
      (*(local_78->super_Namer)._vptr_Namer[0x12])(&local_70,local_78,field);
      CodeWriter::SetValue(local_88,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD_OTY",&local_89);
      ObjectFieldType_abi_cxx11_(&local_70,this,field,true);
      CodeWriter::SetValue(local_88,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      piVar1 = &(this->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::function<void_(const_flatbuffers::FieldDef_&)>::operator()(local_80,field);
      iVar2 = (this->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this->code_).cur_ident_lvl_ = iVar2 + -1;
      }
    }
  }
  return;
}

Assistant:

void ForAllObjectTableFields(const StructDef &table,
                               std::function<void(const FieldDef &)> cb) {
    const std::vector<FieldDef *> &v = table.fields.vec;
    for (auto it = v.begin(); it != v.end(); it++) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      code_.SetValue("FIELD", namer_.Field(field));
      code_.SetValue("FIELD_OTY", ObjectFieldType(field, true));
      code_.IncrementIdentLevel();
      cb(field);
      code_.DecrementIdentLevel();
    }
  }